

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenVertexNormalsProcess.cpp
# Opt level: O3

bool __thiscall
Assimp::GenVertexNormalsProcess::GenMeshVertexNormals
          (GenVertexNormalsProcess *this,aiMesh *pMesh,uint meshIndex)

{
  aiFace *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  aiVector3D *paVar7;
  uint *puVar8;
  map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  *list;
  _func_int **pp_Var9;
  _func_int *p_Var10;
  bool bVar11;
  aiVector3D *paVar12;
  ulong uVar13;
  Base **ppBVar14;
  Logger *this_00;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  SpatialSort *this_01;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> verticesFound;
  SpatialSort _vertexFinder;
  ai_real local_b0;
  allocator_type local_aa;
  bool local_a9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  float local_84;
  vector<bool,_std::allocator<bool>_> local_80;
  SpatialSort local_58;
  
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    if (this->force_ != true) {
      return false;
    }
    operator_delete__(pMesh->mNormals);
  }
  if ((pMesh->mPrimitiveTypes & 0xc) == 0) {
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Normal vectors are undefined for line and point meshes");
    return false;
  }
  uVar22 = pMesh->mNumVertices;
  uVar13 = (ulong)uVar22 * 0xc;
  paVar12 = (aiVector3D *)operator_new__(uVar13);
  if ((ulong)uVar22 != 0) {
    memset(paVar12,0,((uVar13 - 0xc) / 0xc) * 0xc + 0xc);
  }
  pMesh->mNormals = paVar12;
  if (pMesh->mNumFaces != 0) {
    uVar13 = 0;
    do {
      paVar1 = pMesh->mFaces + uVar13;
      uVar22 = pMesh->mFaces[uVar13].mNumIndices;
      if (uVar22 < 3) {
        if (uVar22 != 0) {
          uVar15 = 0;
          do {
            paVar7 = pMesh->mNormals;
            uVar22 = paVar1->mIndices[uVar15];
            paVar12 = paVar7 + uVar22;
            paVar12->x = NAN;
            paVar12->y = NAN;
            paVar7[uVar22].z = NAN;
            uVar15 = uVar15 + 1;
          } while (uVar15 < paVar1->mNumIndices);
        }
      }
      else {
        paVar12 = pMesh->mVertices;
        puVar8 = paVar1->mIndices;
        uVar22 = puVar8[uVar22 - 1];
        fVar19 = paVar12[puVar8[1]].x - paVar12[*puVar8].x;
        uVar2 = paVar12[puVar8[1]].y;
        uVar4 = paVar12[puVar8[1]].z;
        uVar3 = paVar12[*puVar8].y;
        uVar5 = paVar12[*puVar8].z;
        fVar18 = paVar12[uVar22].y - (float)uVar3;
        fVar20 = paVar12[uVar22].z - (float)uVar5;
        fVar21 = paVar12[uVar22].x - paVar12[*puVar8].x;
        fVar24 = ((float)uVar2 - (float)uVar3) * fVar20 - fVar18 * ((float)uVar4 - (float)uVar5);
        fVar20 = ((float)uVar4 - (float)uVar5) * fVar21 - fVar20 * fVar19;
        fVar18 = fVar18 * fVar19 - fVar21 * ((float)uVar2 - (float)uVar3);
        fVar21 = SQRT(fVar18 * fVar18 + fVar24 * fVar24 + fVar20 * fVar20);
        fVar19 = 1.0 / fVar21;
        if (0.0 < fVar21) {
          fVar24 = fVar24 * fVar19;
          fVar20 = fVar20 * fVar19;
        }
        uVar15 = 0;
        do {
          paVar7 = pMesh->mNormals;
          uVar22 = paVar1->mIndices[uVar15];
          paVar12 = paVar7 + uVar22;
          paVar12->x = fVar24;
          paVar12->y = fVar20;
          paVar7[uVar22].z =
               (float)(~-(uint)(0.0 < fVar21) & (uint)fVar18 |
                      (uint)(fVar19 * fVar18) & -(uint)(0.0 < fVar21));
          uVar15 = uVar15 + 1;
        } while (uVar15 < paVar1->mNumIndices);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < pMesh->mNumFaces);
  }
  SpatialSort::SpatialSort(&local_58);
  list = &((this->super_BaseProcess).shared)->pmap;
  if (list != (map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
               *)0x0) {
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ppBVar14 = GetGenericProperty<Assimp::SharedPostProcessInfo::Base*>
                         (list,"$Spat",(Base **)&local_80);
    if ((*ppBVar14 != (Base *)0x0) &&
       (pp_Var9 = (*ppBVar14)[1]._vptr_Base, pp_Var9 != (_func_int **)0x0)) {
      p_Var10 = *pp_Var9;
      this_01 = (SpatialSort *)(p_Var10 + (ulong)meshIndex * 0x30);
      local_b0 = *(ai_real *)(p_Var10 + (ulong)meshIndex * 0x30 + 0x28);
      goto LAB_003cbee8;
    }
  }
  this_01 = &local_58;
  SpatialSort::Fill(this_01,pMesh->mVertices,pMesh->mNumVertices,0xc,true);
  local_b0 = ComputePositionEpsilon(pMesh);
LAB_003cbee8:
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar13 = (ulong)pMesh->mNumVertices;
  paVar12 = (aiVector3D *)operator_new__(uVar13 * 0xc);
  if (uVar13 != 0) {
    memset(paVar12,0,((uVar13 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  if (3.054326 <= this->configMaxAngle) {
    local_a9 = false;
    std::vector<bool,_std::allocator<bool>_>::vector(&local_80,uVar13,&local_a9,&local_aa);
    if (pMesh->mNumVertices != 0) {
      uVar13 = 0;
      do {
        if ((local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
          SpatialSort::FindPositions(this_01,pMesh->mVertices + uVar13,local_b0,&local_a8);
          if ((long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start == 0) {
            fVar19 = 0.0;
            fVar24 = 0.0;
            fVar18 = 0.0;
          }
          else {
            paVar7 = pMesh->mNormals;
            fVar19 = 0.0;
            fVar24 = 0.0;
            fVar18 = 0.0;
            uVar15 = 0;
            do {
              uVar22 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar15];
              fVar20 = paVar7[uVar22].x;
              if ((~(uint)fVar20 & 0x7f800000) != 0 || ((uint)fVar20 & 0x7fffff) == 0) {
                fVar19 = fVar19 + fVar20;
                fVar24 = fVar24 + paVar7[uVar22].y;
                fVar18 = fVar18 + paVar7[uVar22].z;
              }
              uVar15 = uVar15 + 1;
            } while ((uVar15 & 0xffffffff) <
                     (ulong)((long)local_a8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_a8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
          }
          fVar20 = SQRT(fVar18 * fVar18 + fVar19 * fVar19 + fVar24 * fVar24);
          fVar21 = 1.0 / fVar20;
          if (0.0 < fVar20) {
            fVar18 = fVar18 * fVar21;
          }
          if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar22 = (int)((uint)(0.0 < fVar20) << 0x1f) >> 0x1f;
            uVar23 = (int)((uint)(0.0 < fVar20) << 0x1f) >> 0x1f;
            uVar15 = 0;
            uVar16 = 1;
            do {
              uVar6 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar15];
              paVar12[uVar6].x = (float)(~uVar22 & (uint)fVar19 | (uint)(fVar21 * fVar19) & uVar22);
              paVar12[uVar6].y = (float)(~uVar23 & (uint)fVar24 | (uint)(fVar21 * fVar24) & uVar23);
              paVar12[uVar6].z = fVar18;
              local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] =
                   local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] |
                   1L << ((byte)uVar6 & 0x3f);
              bVar11 = uVar16 < (ulong)((long)local_a8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_a8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 2);
              uVar15 = uVar16;
              uVar16 = (ulong)((int)uVar16 + 1);
            } while (bVar11);
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < pMesh->mNumVertices);
    }
    if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  else {
    fVar18 = cosf(this->configMaxAngle);
    if (pMesh->mNumVertices != 0) {
      uVar13 = 0;
      local_84 = fVar18;
      do {
        SpatialSort::FindPositions(this_01,pMesh->mVertices + uVar13,local_b0,&local_a8);
        if ((long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start == 0) {
          fVar18 = 0.0;
          fVar19 = 0.0;
          fVar24 = 0.0;
        }
        else {
          paVar7 = pMesh->mNormals;
          fVar18 = 0.0;
          fVar19 = 0.0;
          fVar24 = 0.0;
          uVar15 = 0;
          do {
            uVar17 = (ulong)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15];
            uVar16._0_4_ = paVar7[uVar17].x;
            uVar16._4_4_ = paVar7[uVar17].y;
            if ((~(undefined4)uVar16 & 0x7f800000) != 0 || (uVar16 & 0x7fffff) == 0) {
              if ((uVar13 == uVar17) ||
                 (local_84 <=
                  paVar7[uVar17].z * paVar7[uVar13].z +
                  (float)(undefined4)uVar16 * paVar7[uVar13].x +
                  (float)uVar16._4_4_ * paVar7[uVar13].y)) {
                fVar18 = fVar18 + (float)(undefined4)uVar16;
                fVar19 = fVar19 + (float)uVar16._4_4_;
                fVar24 = fVar24 + paVar7[uVar17].z;
              }
            }
            uVar15 = uVar15 + 1;
          } while ((uVar15 & 0xffffffff) <
                   (ulong)((long)local_a8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_a8.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        fVar21 = SQRT(fVar24 * fVar24 + fVar18 * fVar18 + fVar19 * fVar19);
        fVar20 = 1.0 / fVar21;
        if (0.0 < fVar21) {
          fVar24 = fVar24 * fVar20;
        }
        uVar22 = (int)((uint)(0.0 < fVar21) << 0x1f) >> 0x1f;
        uVar23 = (int)((uint)(0.0 < fVar21) << 0x1f) >> 0x1f;
        uVar15 = CONCAT44(~uVar23 & (uint)fVar19,~uVar22 & (uint)fVar18) |
                 CONCAT44((uint)(fVar20 * fVar19) & uVar23,(uint)(fVar20 * fVar18) & uVar22);
        paVar12[uVar13].x = (float)(int)uVar15;
        paVar12[uVar13].y = (float)(int)(uVar15 >> 0x20);
        paVar12[uVar13].z = fVar24;
        uVar13 = uVar13 + 1;
      } while (uVar13 < pMesh->mNumVertices);
    }
  }
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    operator_delete__(pMesh->mNormals);
  }
  pMesh->mNormals = paVar12;
  if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  SpatialSort::~SpatialSort(&local_58);
  return true;
}

Assistant:

bool GenVertexNormalsProcess::GenMeshVertexNormals (aiMesh* pMesh, unsigned int meshIndex)
{
    if (NULL != pMesh->mNormals) {
        if (force_) delete[] pMesh->mNormals;
        else return false;
    }

    // If the mesh consists of lines and/or points but not of
    // triangles or higher-order polygons the normal vectors
    // are undefined.
    if (!(pMesh->mPrimitiveTypes & (aiPrimitiveType_TRIANGLE | aiPrimitiveType_POLYGON)))
    {
        ASSIMP_LOG_INFO("Normal vectors are undefined for line and point meshes");
        return false;
    }

    // Allocate the array to hold the output normals
    const float qnan = std::numeric_limits<ai_real>::quiet_NaN();
    pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];

    // Compute per-face normals but store them per-vertex
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        const aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices < 3)
        {
            // either a point or a line -> no normal vector
            for (unsigned int i = 0;i < face.mNumIndices;++i) {
                pMesh->mNormals[face.mIndices[i]] = aiVector3D(qnan);
            }

            continue;
        }

        const aiVector3D* pV1 = &pMesh->mVertices[face.mIndices[0]];
        const aiVector3D* pV2 = &pMesh->mVertices[face.mIndices[1]];
        const aiVector3D* pV3 = &pMesh->mVertices[face.mIndices[face.mNumIndices-1]];
        const aiVector3D vNor = ((*pV2 - *pV1) ^ (*pV3 - *pV1)).NormalizeSafe();

        for (unsigned int i = 0;i < face.mNumIndices;++i) {
            pMesh->mNormals[face.mIndices[i]] = vNor;
        }
    }

    // Set up a SpatialSort to quickly find all vertices close to a given position
    // check whether we can reuse the SpatialSort of a previous step.
    SpatialSort* vertexFinder = NULL;
    SpatialSort  _vertexFinder;
    ai_real posEpsilon = ai_real( 1e-5 );
    if (shared) {
        std::vector<std::pair<SpatialSort,ai_real> >* avf;
        shared->GetProperty(AI_SPP_SPATIAL_SORT,avf);
        if (avf)
        {
            std::pair<SpatialSort,ai_real>& blubb = avf->operator [] (meshIndex);
            vertexFinder = &blubb.first;
            posEpsilon = blubb.second;
        }
    }
    if (!vertexFinder)  {
        _vertexFinder.Fill(pMesh->mVertices, pMesh->mNumVertices, sizeof( aiVector3D));
        vertexFinder = &_vertexFinder;
        posEpsilon = ComputePositionEpsilon(pMesh);
    }
    std::vector<unsigned int> verticesFound;
    aiVector3D* pcNew = new aiVector3D[pMesh->mNumVertices];

    if (configMaxAngle >= AI_DEG_TO_RAD( 175.f ))   {
        // There is no angle limit. Thus all vertices with positions close
        // to each other will receive the same vertex normal. This allows us
        // to optimize the whole algorithm a little bit ...
        std::vector<bool> abHad(pMesh->mNumVertices,false);
        for (unsigned int i = 0; i < pMesh->mNumVertices;++i)   {
            if (abHad[i]) {
                continue;
            }

            // Get all vertices that share this one ...
            vertexFinder->FindPositions( pMesh->mVertices[i], posEpsilon, verticesFound);

            aiVector3D pcNor;
            for (unsigned int a = 0; a < verticesFound.size(); ++a) {
                const aiVector3D& v = pMesh->mNormals[verticesFound[a]];
                if (is_not_qnan(v.x))pcNor += v;
            }
            pcNor.NormalizeSafe();

            // Write the smoothed normal back to all affected normals
            for (unsigned int a = 0; a < verticesFound.size(); ++a)
            {
                unsigned int vidx = verticesFound[a];
                pcNew[vidx] = pcNor;
                abHad[vidx] = true;
            }
        }
    }
    // Slower code path if a smooth angle is set. There are many ways to achieve
    // the effect, this one is the most straightforward one.
    else    {
        const ai_real fLimit = std::cos(configMaxAngle);
        for (unsigned int i = 0; i < pMesh->mNumVertices;++i)   {
            // Get all vertices that share this one ...
            vertexFinder->FindPositions( pMesh->mVertices[i] , posEpsilon, verticesFound);

            aiVector3D vr = pMesh->mNormals[i];

            aiVector3D pcNor;
            for (unsigned int a = 0; a < verticesFound.size(); ++a) {
                aiVector3D v = pMesh->mNormals[verticesFound[a]];

                // Check whether the angle between the two normals is not too large.
                // Skip the angle check on our own normal to avoid false negatives
                // (v*v is not guaranteed to be 1.0 for all unit vectors v)
                if (is_not_qnan(v.x) && (verticesFound[a] == i || (v * vr >= fLimit)))
                    pcNor += v;
            }
            pcNew[i] = pcNor.NormalizeSafe();
        }
    }

    delete[] pMesh->mNormals;
    pMesh->mNormals = pcNew;

    return true;
}